

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O1

uint32_t helper_uhaddsubx_aarch64(uint32_t a,uint32_t b)

{
  return ((b & 0xffff) + (a >> 0x10) & 0xfffffffe) << 0xf | (a & 0xffff) - (b >> 0x10) >> 1 & 0xffff
  ;
}

Assistant:

uint32_t HELPER(glue(PFX,addsubx))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB16(a, b >> 16, 0);
    ADD16(a >> 16, b, 1);
    SET_GE;
    return res;
}